

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

string * svg::vectorToString<svg::Circle>
                   (vector<svg::Circle,_std::allocator<svg::Circle>_> *collection,Layout *layout)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 in_RDX;
  vector<svg::Circle,_std::allocator<svg::Circle>_> *in_RSI;
  string *in_RDI;
  uint i;
  string *combination_str;
  string local_40 [32];
  uint local_20;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI);
  for (local_20 = 0; uVar1 = (ulong)local_20,
      sVar2 = std::vector<svg::Circle,_std::allocator<svg::Circle>_>::size(in_RSI), uVar1 < sVar2;
      local_20 = local_20 + 1) {
    pvVar3 = std::vector<svg::Circle,_std::allocator<svg::Circle>_>::operator[]
                       (in_RSI,(ulong)local_20);
    (*(pvVar3->super_Shape).super_Serializeable._vptr_Serializeable[2])(local_40,pvVar3,local_18);
    std::__cxx11::string::operator+=(in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return in_RDI;
}

Assistant:

inline std::string vectorToString(std::vector<T> collection, Layout const & layout)
    {
        std::string combination_str;
        for (unsigned i = 0; i < collection.size(); ++i)
            combination_str += collection[i].toString(layout);

        return combination_str;
    }